

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSource.cpp
# Opt level: O0

int __thiscall csv::icu::FileDataSource::open(FileDataSource *this,char *__file,int __oflag,...)

{
  bool bVar1;
  long lVar2;
  undefined8 uVar3;
  UFILE *pUVar4;
  FILE *__stream;
  char *local_d0;
  FILE *internal_file;
  undefined1 local_a8 [8];
  detected_language detected;
  allocator local_49;
  string local_48 [8];
  string file_codepage;
  char *codepage_local;
  char *file_local;
  FileDataSource *this_local;
  
  close(this,(int)__file);
  local_d0 = ___oflag;
  if (___oflag == (char *)0x0) {
    local_d0 = "";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,local_d0,&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  lVar2 = std::__cxx11::string::length();
  if (lVar2 == 0) {
    encoding::TextEncodingForFile((detected_language *)local_a8,__file);
    bVar1 = encoding::detected_language::invalid((detected_language *)local_a8);
    if (bVar1) {
      this_local._7_1_ = 0;
    }
    else {
      std::__cxx11::string::operator=(local_48,(string *)local_a8);
    }
    encoding::detected_language::~detected_language((detected_language *)local_a8);
    if (bVar1) goto LAB_0012eb36;
  }
  uVar3 = std::__cxx11::string::c_str();
  pUVar4 = (UFILE *)u_fopen_70(__file,"rb",0,uVar3);
  this->_in = pUVar4;
  if (this->_in != (UFILE *)0x0) {
    __stream = (FILE *)u_fgetfile_70(this->_in);
    fseek(__stream,0,2);
    lVar2 = ftell(__stream);
    this->_length = lVar2;
    fseek(__stream,0,0);
  }
  this_local._7_1_ = this->_in != (UFILE *)0x0;
LAB_0012eb36:
  uVar3 = std::__cxx11::string::~string(local_48);
  return (uint)CONCAT71((int7)((ulong)uVar3 >> 8),this_local._7_1_) & 0xffffff01;
}

Assistant:

bool FileDataSource::open(const char* file, const char* codepage) {

		// Close if we have one open already
		close();

		std::string file_codepage = codepage ?: "";
		if (file_codepage.length() == 0) {
			const auto detected = encoding::TextEncodingForFile(file);
			if (detected.invalid()) {
				return false;
			}
			file_codepage = detected.name;
		}

		_in = u_fopen(file, "rb", NULL, file_codepage.c_str());
		if (_in != NULL) {
			FILE* internal_file = u_fgetfile(_in);
			fseek(internal_file, 0L, SEEK_END);
			_length = ftell(internal_file);
			fseek(internal_file, 0L, SEEK_SET);
		}

		return _in != NULL;
	}